

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O2

void __thiscall lattice::supercell::~supercell(supercell *this)

{
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->index2lcord_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->lcord2index_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  Eigen::DenseStorage<long,_-1,_-1,_1,_0>::~DenseStorage
            ((DenseStorage<long,__1,__1,_1,_0> *)&this->nmax_);
  Eigen::DenseStorage<long,_-1,_-1,_1,_0>::~DenseStorage
            ((DenseStorage<long,__1,__1,_1,_0> *)&this->nmin_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->rs_);
  Eigen::DenseStorage<long,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<long,__1,__1,__1,_0> *)&this->span_);
  return;
}

Assistant:

supercell() {}